

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template1.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x78);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
	cout << Factorial<5>::v << endl;    // 120
	cout << Factorial<1>::v << endl;    // 1
	cout << Factorial<0>::v << endl;    // 0
}